

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int gpioWaveTxAt(void)

{
  FILE *pFVar1;
  char *pcVar2;
  int cb;
  int i;
  int local_8;
  int local_4;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar2 = myTimeStamp();
    fprintf(pFVar1,"%s %s: \n",pcVar2,"gpioWaveTxAt");
  }
  pFVar1 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar2,"gpioWaveTxAt");
    }
    local_4 = -0x1f;
  }
  else {
    local_4 = dmaNowAtOCB();
    if (local_4 < 0) {
      local_4 = -local_4;
    }
    else {
      for (local_8 = 0; local_8 < 0xfa; local_8 = local_8 + 1) {
        if (((waveInfo[local_8].deleted == 0) && ((int)(uint)waveInfo[local_8].botCB <= local_4)) &&
           (local_4 <= (int)(uint)waveInfo[local_8].topCB)) {
          return local_8;
        }
      }
      local_4 = 0x270e;
    }
  }
  return local_4;
}

Assistant:

int gpioWaveTxAt(void)
{
   int i, cb;

   DBG(DBG_USER, "");

   CHECK_INITED;

   cb = dmaNowAtOCB();

   if (cb < 0) return -cb;

   for (i=0; i<PI_MAX_WAVES; i++)
   {
      if ( !waveInfo[i].deleted &&
          (cb >= waveInfo[i].botCB) &&
          (cb <= waveInfo[i].topCB) ) return i;
   }

   return PI_WAVE_NOT_FOUND;
}